

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ProgressBar::ProgressBar(ProgressBar *this,QWidget *parent)

{
  ProgressBarPrivate *this_00;
  ProgressBar *ctx;
  Object local_30 [8];
  code *local_28;
  undefined8 uStack_20;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001ae7f8;
  *(undefined ***)&this->field_0x10 = &PTR__ProgressBar_001ae9a8;
  this_00 = (ProgressBarPrivate *)operator_new(0x68);
  ctx = this;
  ProgressBarPrivate::ProgressBarPrivate(this_00,this);
  (this->d).d = this_00;
  ProgressBarPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  local_28 = _q_animation;
  uStack_20 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::ProgressBar::*)(QVariant_const&)>
            (local_30,(offset_in_QVariantAnimation_to_subr)((this->d).d)->animation,
             (Object *)QVariantAnimation::valueChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

ProgressBar::ProgressBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new ProgressBarPrivate( this ) )
{
	d->init();

	connect( d->animation, &QVariantAnimation::valueChanged,
		this, &ProgressBar::_q_animation );
}